

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::read_from_stream
               (image_u8 *dest,data_stream_serializer *serializer,uint read_flags)

{
  bool bVar1;
  dynamic_string ext;
  dynamic_string local_30;
  
  if ((1 < read_flags) || (serializer->m_pStream == (data_stream *)0x0)) {
    return false;
  }
  dynamic_string::dynamic_string(&local_30,&serializer->m_pStream->m_name);
  file_utils::get_extension(&local_30);
  bVar1 = dynamic_string::operator==(&local_30,"jpg");
  if (bVar1) {
    if (read_flags != 0) {
LAB_001155e4:
      bVar1 = read_from_stream_stb(serializer,dest);
      goto LAB_0011561a;
    }
  }
  else {
    bVar1 = dynamic_string::operator==(&local_30,"jpeg");
    if (read_flags != 0 || !bVar1) goto LAB_001155e4;
  }
  bVar1 = read_from_stream_jpgd(serializer,dest);
LAB_0011561a:
  dynamic_string::~dynamic_string(&local_30);
  return bVar1;
}

Assistant:

bool read_from_stream(image_u8& dest, data_stream_serializer& serializer, uint read_flags)
        {
            if (read_flags > cReadFlagsAllFlags)
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (!serializer.get_stream())
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            dynamic_string ext(serializer.get_name());
            file_utils::get_extension(ext);

            if ((ext == "jpg") || (ext == "jpeg"))
            {
                // Use my jpeg decoder by default because it supports progressive jpeg's.
                if ((read_flags & cReadFlagForceSTB) == 0)
                {
                    return image_utils::read_from_stream_jpgd(serializer, dest);
                }
            }

            return image_utils::read_from_stream_stb(serializer, dest);
        }